

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O1

void __thiscall
RandomTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>::~RandomTestData
          (RandomTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> *this)

{
  pointer pwVar1;
  
  std::
  vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
  ::~vector(&this->m_tokens);
  pwVar1 = (this->m_str).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pwVar1 != (pointer)0x0) {
    operator_delete(pwVar1,(long)(this->m_str).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pwVar1);
  }
  pwVar1 = (this->m_delim).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pwVar1 != (pointer)0x0) {
    operator_delete(pwVar1,(long)(this->m_delim).
                                 super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pwVar1);
    return;
  }
  return;
}

Assistant:

RandomTestData(T in_delim = default_delim<T>, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		m_delim.insert(m_delim.end(), in_delim);
		populate();
	}